

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_schnorrsig.cpp
# Opt level: O1

Pubkey * cfd::core::SchnorrUtil::ComputeSigPointBatch
                   (Pubkey *__return_storage_ptr__,
                   vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *msgs,
                   vector<cfd::core::SchnorrPubkey,_std::allocator<cfd::core::SchnorrPubkey>_>
                   *nonces,SchnorrPubkey *pubkey)

{
  pointer pBVar1;
  pointer pBVar2;
  pointer pSVar3;
  pointer puVar4;
  Pubkey *pPVar5;
  pointer __dest;
  void *pvVar6;
  CfdException *this;
  pointer this_00;
  size_t sVar7;
  long lVar8;
  ulong uVar9;
  initializer_list<cfd::core::Pubkey> __l;
  Pubkey xe;
  Privkey res;
  Pubkey rs;
  ByteData bip340_challenge;
  string local_1b8;
  void *pvStack_198;
  long local_190;
  Pubkey local_180;
  Privkey local_168;
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *local_140;
  Pubkey local_138;
  Pubkey local_120;
  Pubkey local_108;
  SchnorrPubkey *local_f0;
  ByteData local_e8;
  ByteData local_d0;
  ByteData local_b8;
  Pubkey *local_a0;
  vector<cfd::core::SchnorrPubkey,_std::allocator<cfd::core::SchnorrPubkey>_> *local_98;
  ByteData local_90;
  ByteData local_78;
  ByteData local_60;
  ByteData local_48;
  
  pBVar1 = (msgs->
           super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  pBVar2 = (msgs->
           super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>).
           _M_impl.super__Vector_impl_data._M_start;
  local_140 = msgs;
  local_f0 = pubkey;
  if ((pBVar1 != pBVar2) &&
     ((long)pBVar1 - (long)pBVar2 ==
      (long)(nonces->
            super__Vector_base<cfd::core::SchnorrPubkey,_std::allocator<cfd::core::SchnorrPubkey>_>)
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)(nonces->
            super__Vector_base<cfd::core::SchnorrPubkey,_std::allocator<cfd::core::SchnorrPubkey>_>)
            ._M_impl.super__Vector_impl_data._M_start)) {
    local_a0 = __return_storage_ptr__;
    Pubkey::Pubkey(&local_120);
    local_98 = nonces;
    if ((long)(local_140->
              super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>).
              _M_impl.super__Vector_impl_data._M_finish -
        (long)(local_140->
              super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>).
              _M_impl.super__Vector_impl_data._M_start == 0x18) {
      local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b8,"02","");
      ByteData::ByteData(&local_108.data_,&local_1b8);
      ByteData256::GetData
                (&local_180.data_,
                 &((nonces->
                   super__Vector_base<cfd::core::SchnorrPubkey,_std::allocator<cfd::core::SchnorrPubkey>_>
                   )._M_impl.super__Vector_impl_data._M_start)->data_);
      ByteData::Concat<cfd::core::ByteData>(&local_60,&local_108.data_,&local_180.data_);
      Pubkey::Pubkey((Pubkey *)&local_168,&local_60);
      puVar4 = local_120.data_.data_.
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      local_120.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start =
           local_168.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start;
      local_120.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_finish =
           local_168.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      local_120.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage =
           local_168.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage;
      local_168.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_168.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_168.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      if (puVar4 != (pointer)0x0) {
        operator_delete(puVar4);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_168.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
             ._M_impl.super__Vector_impl_data._M_start !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        operator_delete(local_168.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_60.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_60.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_180.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_180.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_108.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_108.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
        operator_delete(local_1b8._M_dataplus._M_p);
      }
    }
    else {
      local_168.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_168.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_168.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      this_00 = (nonces->
                super__Vector_base<cfd::core::SchnorrPubkey,_std::allocator<cfd::core::SchnorrPubkey>_>
                )._M_impl.super__Vector_impl_data._M_start;
      pSVar3 = (nonces->
               super__Vector_base<cfd::core::SchnorrPubkey,_std::allocator<cfd::core::SchnorrPubkey>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      if (this_00 != pSVar3) {
        do {
          local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b8,"02","");
          ByteData::ByteData(&local_180.data_,&local_1b8);
          ByteData256::GetData(&local_138.data_,&this_00->data_);
          ByteData::Concat<cfd::core::ByteData>(&local_48,&local_180.data_,&local_138.data_);
          Pubkey::Pubkey(&local_108,&local_48);
          ::std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::
          emplace_back<cfd::core::Pubkey>
                    ((vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> *)&local_168,
                     &local_108);
          if (local_108.data_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_108.data_.data_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
          }
          if (local_48.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_48.data_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
          }
          if (local_138.data_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_138.data_.data_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
          }
          if (local_180.data_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_180.data_.data_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
            operator_delete(local_1b8._M_dataplus._M_p);
          }
          this_00 = this_00 + 1;
        } while (this_00 != pSVar3);
      }
      Pubkey::CombinePubkey
                ((Pubkey *)&local_1b8,
                 (vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> *)&local_168);
      puVar4 = local_120.data_.data_.
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      local_120.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)local_1b8._M_dataplus._M_p;
      local_120.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)local_1b8._M_string_length;
      local_120.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)local_1b8.field_2._M_allocated_capacity;
      local_1b8._M_dataplus._M_p = (pointer)0x0;
      local_1b8._M_string_length = 0;
      local_1b8.field_2._M_allocated_capacity = 0;
      if (puVar4 != (pointer)0x0) {
        operator_delete(puVar4);
      }
      if (local_1b8._M_dataplus._M_p != (pointer)0x0) {
        operator_delete(local_1b8._M_dataplus._M_p);
      }
      ::std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::~vector
                ((vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> *)&local_168);
    }
    local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_1b8,
               "7bb52d7a9fef58323eb1bf7a407db382d2f3f2d81bb1224f49fe518f6d48d37c7bb52d7a9fef58323eb1bf7a407db382d2f3f2d81bb1224f49fe518f6d48d37c"
               ,"");
    ByteData::ByteData(&local_108.data_,&local_1b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
      operator_delete(local_1b8._M_dataplus._M_p);
    }
    Privkey::Privkey(&local_168);
    if ((local_140->
        super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>)._M_impl
        .super__Vector_impl_data._M_finish !=
        (local_140->
        super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>)._M_impl
        .super__Vector_impl_data._M_start) {
      lVar8 = 0;
      uVar9 = 0;
      do {
        ByteData256::GetData
                  (&local_b8,
                   (ByteData256 *)
                   ((long)&(((local_98->
                             super__Vector_base<cfd::core::SchnorrPubkey,_std::allocator<cfd::core::SchnorrPubkey>_>
                             )._M_impl.super__Vector_impl_data._M_start)->data_).data_.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_> + lVar8
                   ));
        ByteData::Concat<cfd::core::ByteData>(&local_e8,&local_108.data_,&local_b8);
        ByteData256::GetData(&local_d0,&local_f0->data_);
        ByteData::Concat<cfd::core::ByteData>(&local_138.data_,&local_e8,&local_d0);
        ByteData::Concat<cfd::core::ByteData256>
                  ((ByteData *)&local_1b8,&local_138.data_,
                   (ByteData256 *)
                   ((long)&(((local_140->
                             super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
                             )._M_impl.super__Vector_impl_data._M_start)->data_).
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                   + lVar8));
        HashUtil::Sha256((ByteData256 *)&local_180,(ByteData *)&local_1b8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1b8._M_dataplus._M_p !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          operator_delete(local_1b8._M_dataplus._M_p);
        }
        if (local_138.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_138.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        if (local_d0.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
            .super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_d0.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        if (local_e8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
            .super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_e8.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        if (local_b8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
            .super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_b8.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        if (uVar9 == 0) {
          Privkey::Privkey((Privkey *)&local_1b8,(ByteData256 *)&local_180,kMainnet,true);
        }
        else {
          Privkey::CreateTweakAdd((Privkey *)&local_1b8,&local_168,(ByteData256 *)&local_180);
        }
        puVar4 = local_168.data_.data_.
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start;
        local_168.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)local_1b8._M_dataplus._M_p;
        local_168.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)local_1b8._M_string_length;
        local_168.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage =
             (pointer)local_1b8.field_2._M_allocated_capacity;
        local_1b8._M_dataplus._M_p = (pointer)0x0;
        local_1b8._M_string_length = 0;
        local_1b8.field_2._M_allocated_capacity = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar4 !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          operator_delete(puVar4);
        }
        local_168.is_compressed_ = (bool)local_1b8.field_2._M_local_buf[8];
        local_168._25_3_ = local_1b8.field_2._9_3_;
        local_168.net_type_ = local_1b8.field_2._12_4_;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1b8._M_dataplus._M_p !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          operator_delete(local_1b8._M_dataplus._M_p);
        }
        if (local_180.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_180.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        uVar9 = uVar9 + 1;
        lVar8 = lVar8 + 0x18;
      } while (uVar9 < (ulong)(((long)(local_140->
                                      super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
                                      )._M_impl.super__Vector_impl_data._M_finish -
                                (long)(local_140->
                                      super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
                                      )._M_impl.super__Vector_impl_data._M_start >> 3) *
                              -0x5555555555555555));
    }
    local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b8,"02","");
    ByteData::ByteData(&local_e8,&local_1b8);
    ByteData256::GetData(&local_b8,&local_f0->data_);
    ByteData::Concat<cfd::core::ByteData>(&local_78,&local_e8,&local_b8);
    Pubkey::Pubkey(&local_138,&local_78);
    Privkey::GetData(&local_90,&local_168);
    ByteData256::ByteData256((ByteData256 *)&local_d0,&local_90);
    Pubkey::CreateTweakMul(&local_180,&local_138,(ByteData256 *)&local_d0);
    if (local_d0.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_d0.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_90.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_90.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_138.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_138.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_78.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_78.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_b8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_b8.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_e8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_e8.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
      operator_delete(local_1b8._M_dataplus._M_p);
    }
    local_1b8._M_dataplus._M_p = (pointer)0x0;
    local_1b8._M_string_length = 0;
    local_1b8.field_2._M_allocated_capacity = 0;
    uVar9 = (long)local_120.data_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_120.data_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start;
    if (uVar9 == 0) {
      __dest = (pointer)0x0;
    }
    else {
      if ((long)uVar9 < 0) {
        ::std::__throw_bad_alloc();
      }
      __dest = (pointer)operator_new(uVar9);
    }
    local_1b8.field_2._M_allocated_capacity = (size_type)(__dest + uVar9);
    sVar7 = (long)local_120.data_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_120.data_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start;
    local_1b8._M_dataplus._M_p = __dest;
    if (sVar7 != 0) {
      local_1b8._M_string_length = (size_type)__dest;
      memmove(__dest,local_120.data_.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start,sVar7);
    }
    local_1b8._M_string_length = (size_type)(__dest + sVar7);
    local_1b8.field_2._8_8_ = 0;
    pvStack_198 = (void *)0x0;
    local_190 = 0;
    uVar9 = (long)local_180.data_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_180.data_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start;
    if (uVar9 == 0) {
      pvVar6 = (void *)0x0;
    }
    else {
      if ((long)uVar9 < 0) {
        ::std::__throw_bad_alloc();
      }
      pvVar6 = operator_new(uVar9);
    }
    local_190 = (long)pvVar6 + uVar9;
    sVar7 = (long)local_180.data_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_180.data_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start;
    local_1b8.field_2._8_8_ = pvVar6;
    if (sVar7 != 0) {
      pvStack_198 = pvVar6;
      memmove(pvVar6,local_180.data_.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start,sVar7);
    }
    pvStack_198 = (void *)((long)pvVar6 + sVar7);
    __l._M_len = 2;
    __l._M_array = (iterator)&local_1b8;
    ::std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::vector
              ((vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> *)&local_138,__l,
               (allocator_type *)&local_e8);
    pPVar5 = local_a0;
    Pubkey::CombinePubkey
              (local_a0,(vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> *)&local_138)
    ;
    ::std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::~vector
              ((vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> *)&local_138);
    lVar8 = 0x18;
    do {
      pvVar6 = *(void **)((long)&local_1b8._M_dataplus._M_p + lVar8);
      if (pvVar6 != (void *)0x0) {
        operator_delete(pvVar6);
      }
      lVar8 = lVar8 + -0x18;
    } while (lVar8 != -0x18);
    if (local_180.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_180.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_168.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      operator_delete(local_168.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_108.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_108.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      operator_delete(local_120.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    return pPVar5;
  }
  this = (CfdException *)__cxa_allocate_exception(0x30);
  local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1b8,
             "Expected same number of messages or nonces, and at least one message.","");
  CfdException::CfdException(this,kCfdIllegalArgumentError,&local_1b8);
  __cxa_throw(this,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

Pubkey SchnorrUtil::ComputeSigPointBatch(
    const std::vector<ByteData256> &msgs,
    const std::vector<SchnorrPubkey> &nonces, const SchnorrPubkey &pubkey) {
  if (msgs.size() != nonces.size() || msgs.empty()) {
    throw CfdException(
        CfdError::kCfdIllegalArgumentError,
        "Expected same number of messages or nonces, and at least one "
        "message.");
  }

  Pubkey rs;

  if (msgs.size() == 1) {
    rs = Pubkey(ByteData("02").Concat(nonces[0].GetData()));
  } else {
    std::vector<Pubkey> pub_nonces;
    for (const auto &nonce : nonces) {
      pub_nonces.push_back(Pubkey(ByteData("02").Concat(nonce.GetData())));
    }
    rs = Pubkey::CombinePubkey(pub_nonces);
  }

  auto bip340_challenge = ByteData(
      "7bb52d7a9fef58323eb1bf7a407db382d2f3f2d81bb1224f49fe518f6d48d37c7bb52d7"
      "a9fef58323eb1bf7a407db382d2f3f2d81bb1224f49fe518f6d48d37c");
  Privkey res;
  for (size_t i = 0; i < msgs.size(); i++) {
    auto m_tagged_hash =
        HashUtil::Sha256(bip340_challenge.Concat(nonces[i].GetData())
                             .Concat(pubkey.GetData())
                             .Concat(msgs[i]));
    if (i == 0) {
      res = Privkey(m_tagged_hash);
    } else {
      res = res.CreateTweakAdd(m_tagged_hash);
    }
  }

  auto xe = Pubkey(ByteData("02").Concat(pubkey.GetData()))
                .CreateTweakMul(ByteData256(res.GetData()));

  return Pubkey::CombinePubkey({rs, xe});
}